

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::insert
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          unsigned_long insert_key,value_type v)

{
  bool bVar1;
  
  bVar1 = insert_internal(this,(art_key_type)
                               (insert_key >> 0x38 | (insert_key & 0xff000000000000) >> 0x28 |
                                (insert_key & 0xff0000000000) >> 0x18 |
                                (insert_key & 0xff00000000) >> 8 | (insert_key & 0xff000000) << 8 |
                                (insert_key & 0xff0000) << 0x18 | (insert_key & 0xff00) << 0x28 |
                               insert_key << 0x38),v);
  return bVar1;
}

Assistant:

[[nodiscard]] bool insert(Key insert_key, value_type v) {
    // TODO(thompsonbry) There should be a lambda variant of this to
    // handle conflicts and support upsert or delete-upsert
    // semantics. This would call the caller's lambda once the method
    // was positioned on the leaf.  The caller could then update the
    // value or perhaps delete the entry under the key.
    const auto k = art_key_type{insert_key};
    return insert_internal(k, v);
  }